

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::CloudGroup> *
metaf::CloudGroup::parse(string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  int in_EDX;
  CloudGroup *in_RDI;
  CloudGroup result;
  optional<metaf::CloudType> ct;
  string *in_stack_00000110;
  CloudGroup *this;
  string *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffef0;
  
  if ((in_EDX == 2) || (in_EDX == 3)) {
    parseCloudLayerOrVertVis(in_stack_00000110);
  }
  else if (in_EDX == 4) {
    this = in_RDI;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,(char *)in_RDI);
    if (bVar1) {
      CloudGroup(this,(Type)((ulong)in_RDI >> 0x20),(IncompleteText)in_RDI);
      std::optional<metaf::CloudGroup>::optional<metaf::CloudGroup,_true>
                ((optional<metaf::CloudGroup> *)this,in_RDI);
      in_RDI = this;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,(char *)in_RDI);
      if (bVar1) {
        CloudGroup(this,(Type)((ulong)in_RDI >> 0x20),(IncompleteText)in_RDI);
        std::optional<metaf::CloudGroup>::optional<metaf::CloudGroup,_true>
                  ((optional<metaf::CloudGroup> *)this,in_RDI);
        in_RDI = this;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this,(char *)in_RDI);
        if (bVar1) {
          CloudGroup(this,(Type)((ulong)in_RDI >> 0x20),(IncompleteText)in_RDI);
          std::optional<metaf::CloudGroup>::optional<metaf::CloudGroup,_true>
                    ((optional<metaf::CloudGroup> *)this,in_RDI);
          in_RDI = this;
        }
        else {
          CloudType::fromStringObscuration(in_stack_fffffffffffffe20);
          bVar1 = std::optional<metaf::CloudType>::has_value((optional<metaf::CloudType> *)0x2568cd)
          ;
          if (bVar1) {
            CloudGroup(this,(Type)((ulong)in_RDI >> 0x20),(IncompleteText)in_RDI);
            std::optional<metaf::CloudType>::operator*((optional<metaf::CloudType> *)0x2568f1);
            std::optional<metaf::CloudGroup>::optional<metaf::CloudGroup,_true>
                      ((optional<metaf::CloudGroup> *)this,in_RDI);
            in_RDI = this;
          }
          else {
            parseVariableCloudLayer(in_stack_fffffffffffffef0);
            in_RDI = this;
          }
        }
      }
    }
  }
  else {
    std::optional<metaf::CloudGroup>::optional((optional<metaf::CloudGroup> *)0x25693a);
  }
  return (optional<metaf::CloudGroup> *)in_RDI;
}

Assistant:

std::optional<CloudGroup> CloudGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (reportPart == ReportPart::METAR || reportPart == ReportPart::TAF)
		return parseCloudLayerOrVertVis(group);

	if (reportPart == ReportPart::RMK) {
		if (group == "CLD") return CloudGroup(Type::CLD_MISG, IncompleteText::CLD);
		if (group == "CIG") return CloudGroup(Type::CEILING, IncompleteText::CIG);
		if (group == "CHINO") return CloudGroup(Type::CHINO, IncompleteText::CHINO);
		if (const auto ct = CloudType::fromStringObscuration(group); ct.has_value()) {
			CloudGroup result = CloudGroup(Type::OBSCURATION, IncompleteText::OBSCURATION);
			result.cldTp = *ct;
			return result;
		}
		return parseVariableCloudLayer(group); 
	}
	return std::optional<CloudGroup>();
}